

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

Elements *
ftxui::operator|(Elements *__return_storage_ptr__,Elements *elements,Decorator *decorator)

{
  pointer psVar1;
  pointer psVar2;
  Element local_78;
  ftxui local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar1 = (elements->
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (elements->
                super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                )._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    local_78.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar2->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_78.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (psVar2->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (psVar2->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (psVar2->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              (&local_50,decorator);
    operator|(local_60,&local_78,&local_50);
    std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>::
    emplace_back<std::shared_ptr<ftxui::Node>>
              ((vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>> *)
               __return_storage_ptr__,(shared_ptr<ftxui::Node> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

Elements operator|(Elements elements, Decorator decorator) {
  Elements output;
  for (auto& it : elements)
    output.push_back(std::move(it) | decorator);
  return output;
}